

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::AddSymbol
          (DescriptorBuilder *this,string_view full_name,void *parent,string_view name,
          Message *proto,Symbol symbol)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  string_view v;
  code *pcVar1;
  bool bVar2;
  LogMessage *pLVar3;
  FileDescriptor *parent_00;
  string_view haystack;
  string_view element_name;
  undefined4 uVar4;
  LogMessage local_a8;
  string_view full_name_local;
  size_type dot_pos;
  FileDescriptor *other_file;
  Symbol *local_70;
  code *pcStack_68;
  Symbol *local_60;
  code *pcStack_58;
  Symbol *local_50;
  code *pcStack_48;
  string_view **local_40;
  code *pcStack_38;
  
  full_name_local._M_str = full_name._M_str;
  full_name_local._M_len = full_name._M_len;
  parent_00 = (FileDescriptor *)parent;
  if (parent == (void *)0x0) {
    parent_00 = this->file_;
  }
  haystack._M_str = (char *)0x0;
  haystack._M_len = (size_t)full_name_local._M_str;
  bVar2 = absl::lts_20250127::StrContains
                    ((lts_20250127 *)full_name_local._M_len,haystack,(char)parent);
  if (bVar2) {
    local_a8._0_8_ = &full_name_local;
    local_40 = (string_view **)&local_a8;
    pcStack_38 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__0,std::__cxx11::string>
    ;
    make_error.invoker_._0_4_ = 0x1e6d1a;
    make_error.ptr_.obj = local_40;
    make_error.invoker_._4_4_ = 0;
    AddError(this,full_name,proto,NAME,make_error);
  }
  else {
    bVar2 = DescriptorPool::Tables::AddSymbol(this->tables_,full_name,symbol);
    if (bVar2) {
      bVar2 = FileDescriptorTables::AddAliasUnderParent(this->file_tables_,parent_00,name,symbol);
      if (bVar2) {
        return true;
      }
      if (this->had_errors_ == false) {
        absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x161a);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (&local_a8,(char (*) [2])0x3b97de);
        v._M_str = full_name_local._M_str;
        v._M_len = full_name_local._M_len;
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (pLVar3,(char (*) [113])
                          "\" not previously defined in symbols_by_name_, but was defined in symbols_by_parent_; this shouldn\'t be possible."
                  );
        absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_a8);
      }
    }
    else {
      local_a8._0_8_ = DescriptorPool::Tables::FindSymbol(this->tables_,full_name);
      other_file = Symbol::GetFile((Symbol *)&local_a8);
      if (other_file == this->file_) {
        dot_pos = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                            (&full_name_local,'.',0xffffffffffffffff);
        if (dot_pos == 0xffffffffffffffff) {
          pcStack_48 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__1,std::__cxx11::string>
          ;
          pcVar1 = pcStack_48;
          pcStack_48._0_4_ = 0x1e6d87;
          uVar4 = pcStack_48._0_4_;
          local_50 = (Symbol *)&local_a8;
          pcStack_48 = pcVar1;
        }
        else {
          local_a8.data_._M_t.
          super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          ._M_t.
          super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          .
          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                )&dot_pos;
          pcStack_58 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__2,std::__cxx11::string>
          ;
          pcVar1 = pcStack_58;
          pcStack_58._0_4_ = 0x1e6df4;
          uVar4 = pcStack_58._0_4_;
          local_60 = (Symbol *)&local_a8;
          pcStack_58 = pcVar1;
        }
      }
      else {
        local_a8.data_._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
              )&other_file;
        pcStack_68 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::AddSymbol(std::basic_string_view<char,std::char_traits<char>>,void_const*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::Symbol)::__3,std::__cxx11::string>
        ;
        uVar4 = 0x1e6ec3;
        local_70 = (Symbol *)&local_a8;
      }
      local_a8._0_8_ = &full_name_local;
      make_error_00.invoker_._0_4_ = uVar4;
      make_error_00.ptr_.obj = &local_a8;
      make_error_00.invoker_._4_4_ = 0;
      element_name._M_str = full_name_local._M_str;
      element_name._M_len = full_name_local._M_len;
      AddError(this,element_name,proto,NAME,make_error_00);
    }
  }
  return false;
}

Assistant:

bool DescriptorBuilder::AddSymbol(const absl::string_view full_name,
                                  const void* parent,
                                  const absl::string_view name,
                                  const Message& proto, Symbol symbol) {
  // If the caller passed nullptr for the parent, the symbol is at file scope.
  // Use its file as the parent instead.
  if (parent == nullptr) parent = file_;

  if (absl::StrContains(full_name, '\0')) {
    AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", full_name, "\" contains null character.");
    });
    return false;
  }
  if (tables_->AddSymbol(full_name, symbol)) {
    if (!file_tables_->AddAliasUnderParent(parent, name, symbol)) {
      // This is only possible if there was already an error adding something of
      // the same name.
      if (!had_errors_) {
        ABSL_DLOG(FATAL) << "\"" << full_name
                         << "\" not previously defined in "
                            "symbols_by_name_, but was defined in "
                            "symbols_by_parent_; this shouldn't be possible.";
      }
      return false;
    }
    return true;
  } else {
    const FileDescriptor* other_file = tables_->FindSymbol(full_name).GetFile();
    if (other_file == file_) {
      std::string::size_type dot_pos = full_name.find_last_of('.');
      if (dot_pos == std::string::npos) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
          return absl::StrCat("\"", full_name, "\" is already defined.");
        });
      } else {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
          return absl::StrCat("\"", full_name.substr(dot_pos + 1),
                              "\" is already defined in \"",
                              full_name.substr(0, dot_pos), "\".");
        });
      }
    } else {
      // Symbol seems to have been defined in a different file.
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::StrCat(
            "\"", full_name, "\" is already defined in file \"",
            (other_file == nullptr ? "null" : other_file->name()), "\".");
      });
    }
    return false;
  }
}